

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::insert
          (QGenericArrayOps<QDockAreaLayoutItem> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  QDockAreaLayoutItem *in_RCX;
  long lVar2;
  long in_RDX;
  QArrayDataPointer<QDockAreaLayoutItem> *in_RSI;
  QArrayDataPointer<QDockAreaLayoutItem> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  GrowthPosition pos;
  bool growsAtBegin;
  QDockAreaLayoutItem copy;
  undefined7 in_stack_ffffffffffffff50;
  bool bVar4;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint uVar5;
  QArrayDataPointer<QDockAreaLayoutItem> *n_00;
  QDockAreaLayoutItem *in_stack_ffffffffffffff80;
  QDockAreaLayoutItem *in_stack_ffffffffffffff88;
  Inserter *in_stack_ffffffffffffff90;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  memset(local_30,0xaa,0x28);
  QDockAreaLayoutItem::QDockAreaLayoutItem
            (in_RCX,(QDockAreaLayoutItem *)
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  bVar3 = in_RDI->size != 0;
  bVar4 = bVar3 && in_RSI == (QArrayDataPointer<QDockAreaLayoutItem> *)0x0;
  uVar5 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffff5c);
  uVar1 = (uint)(bVar3 && in_RSI == (QArrayDataPointer<QDockAreaLayoutItem> *)0x0);
  QArrayDataPointer<QDockAreaLayoutItem>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),(qsizetype)in_RCX,
             (QDockAreaLayoutItem **)CONCAT44(uVar5,uVar1),
             (QArrayDataPointer<QDockAreaLayoutItem> *)CONCAT17(bVar4,in_stack_ffffffffffffff50));
  if ((uVar5 & 0x1000000) == 0) {
    Inserter::Inserter((Inserter *)&stack0xffffffffffffff80,in_RDI);
    Inserter::insert(in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff80,(qsizetype)n_00);
    Inserter::~Inserter((Inserter *)&stack0xffffffffffffff80);
  }
  else {
    while (lVar2 = in_RDX + -1, in_RDX != 0) {
      QArrayDataPointer<QDockAreaLayoutItem>::begin
                ((QArrayDataPointer<QDockAreaLayoutItem> *)0x60aa72);
      QDockAreaLayoutItem::QDockAreaLayoutItem(in_RCX,(QDockAreaLayoutItem *)CONCAT44(uVar5,uVar1));
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      in_RDX = lVar2;
    }
  }
  QDockAreaLayoutItem::~QDockAreaLayoutItem(in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this).insert(i, copy, n);
        }
    }